

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_writers(void)

{
  int fd;
  FILE *__stream;
  allocator local_299;
  file_writer w_1;
  stream_writer w;
  string local_268;
  string local_248;
  string local_228;
  ofstream f;
  
  std::ofstream::ofstream((ostream *)&f,"test_files/tmp.json",_S_out);
  argo::stream_writer::stream_writer(&w,(ostream *)&f);
  std::__cxx11::string::string((string *)&w_1,"{ \"one\" : 1 }",&local_299);
  argo::operator<<(&w.super_writer,(string *)&w_1);
  std::__cxx11::string::~string((string *)&w_1);
  std::ofstream::close();
  std::__cxx11::string::string((string *)&local_228,"stream",(allocator *)&w_1);
  test_writer(&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::ofstream::~ofstream(&f);
  __stream = fopen("test_files/tmp.json","w");
  argo::file_writer::file_writer(&w_1,(FILE *)__stream);
  std::__cxx11::string::string((string *)&f,"{ \"one\" : 1 }",(allocator *)&w);
  argo::operator<<(&w_1.super_writer,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  fclose(__stream);
  std::__cxx11::string::string((string *)&local_248,"file",(allocator *)&f);
  test_writer(&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  fd = open("test_files/tmp.json",0x41,0);
  argo::fd_writer::fd_writer((fd_writer *)&w_1,fd);
  std::__cxx11::string::string((string *)&f,"{ \"one\" : 1 }",(allocator *)&w);
  argo::operator<<(&w_1.super_writer,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  close(fd);
  std::__cxx11::string::string((string *)&local_268,"fd",(allocator *)&f);
  test_writer(&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  return;
}

Assistant:

void test_writers()
{
    {
        ofstream f("test_files/tmp.json");
        stream_writer w(&f);
        w << "{ \"one\" : 1 }";
        f.close();
        test_writer("stream");
    }

    {
        FILE *f = fopen("test_files/tmp.json", "w");
        file_writer w(f);
        w << "{ \"one\" : 1 }";
        fclose(f);
        test_writer("file");
    }

#ifndef _ARGO_WINDOWS_
    {
        int f = open("test_files/tmp.json", O_CREAT | O_WRONLY, 0);
        fd_writer w(f);
        w << "{ \"one\" : 1 }";
        close(f);
        test_writer("fd");
    }
#endif
}